

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParsePostExpressions(ParseContext *ctx,SynBase *node)

{
  LexemeType LVar1;
  uint uVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  SynBase *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SynBase *pSVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Lexeme *pLVar7;
  Lexeme *pLVar8;
  char *msg;
  undefined1 uVar9;
  SynBase *pSVar10;
  IntrusiveList<SynCallArgument> IVar11;
  bool shrBorrow;
  IntrusiveList<SynBase> aliases;
  bool local_59;
  IntrusiveList<SynBase> local_58;
  SynBase *local_48;
  SynBase *pSStack_40;
  undefined4 extraout_var_00;
  
  while( true ) {
    pSVar10 = node;
    while( true ) {
      pLVar7 = ctx->currentLexeme;
      LVar1 = pLVar7->type;
      if (0x2d < (int)LVar1) break;
      if (LVar1 != lex_point) {
        if (LVar1 == lex_oparen) goto LAB_00114471;
        if (LVar1 != lex_inc) goto LAB_00114759;
        ctx->currentLexeme = pLVar7 + 1;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar6 = (SynBase *)CONCAT44(extraout_var_05,iVar5);
        pLVar8 = ctx->currentLexeme;
        if (pLVar8 <= ctx->firstLexeme) goto LAB_001147d5;
        uVar9 = 1;
        goto LAB_00114797;
      }
      ctx->currentLexeme = pLVar7 + 1;
      if ((pLVar7[1].type == lex_return) ||
         (bVar4 = anon_unknown.dwarf_15703::CheckAt
                            (ctx,lex_string,"ERROR: member name expected after \'.\'"), bVar4)) {
        pLVar7 = ctx->currentLexeme;
        pp_Var3 = (_func_int **)pLVar7->pos;
        uVar2 = pLVar7->length;
        if (pLVar7->type != lex_none) {
          ctx->currentLexeme = pLVar7 + 1;
        }
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar6 = (SynBase *)CONCAT44(extraout_var,iVar5);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
        pLVar7 = ctx->currentLexeme + -1;
        SynBase::SynBase(pSVar6,4,pLVar7,pLVar7);
        pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_002470a0;
        pSVar6[1]._vptr_SynBase = pp_Var3;
        *(ulong *)&pSVar6[1].typeID = (long)pp_Var3 + (ulong)uVar2;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        this = (SynBase *)CONCAT44(extraout_var_00,iVar5);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
        SynBase::SynBase(this,0x17,pSVar10->begin,ctx->currentLexeme + -1);
        this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247530;
        this[1]._vptr_SynBase = (_func_int **)pSVar10;
        *(SynBase **)&this[1].typeID = pSVar6;
        pSVar10 = this;
      }
      else {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar6 = (SynBase *)CONCAT44(extraout_var_01,iVar5);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
        pLVar7 = ctx->currentLexeme + -1;
        SynBase::SynBase(pSVar6,0x17,pLVar7,pLVar7);
        pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247530;
        pSVar6[1]._vptr_SynBase = (_func_int **)pSVar10;
        *(undefined8 *)&pSVar6[1].typeID = 0;
        pSVar10 = pSVar6;
      }
    }
    if ((LVar1 != lex_obracket) && (LVar1 != lex_with)) break;
LAB_00114471:
    if (ctx->currentLexeme->type == lex_obracket) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      IVar11 = ParseCallArguments(ctx);
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      node = (SynBase *)CONCAT44(extraout_var_02,iVar5);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
      SynBase::SynBase(node,0x19,pLVar7,ctx->currentLexeme + -1);
      node->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247568;
      node[1]._vptr_SynBase = (_func_int **)pSVar10;
      *(IntrusiveList<SynCallArgument> *)&node[1].typeID = IVar11;
    }
    else if (ctx->currentLexeme->type == lex_with) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      local_58.head = (SynBase *)0x0;
      local_58.tail = (SynBase *)0x0;
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,lex_less,"ERROR: \'<\' not found before explicit generic type alias list");
      local_59 = false;
      while( true ) {
        pSVar6 = ParseType(ctx,&local_59,false);
        if (pSVar6 == (SynBase *)0x0) {
          if (local_58.head == (SynBase *)0x0) {
            msg = "ERROR: type name is expected after \'with\'";
          }
          else {
            msg = "ERROR: type name is expected after \',\'";
          }
          anon_unknown.dwarf_15703::Report(ctx,ctx->currentLexeme,msg);
        }
        else {
          IntrusiveList<SynBase>::push_back(&local_58,pSVar6);
        }
        if ((pSVar6 == (SynBase *)0x0) || (ctx->currentLexeme->type != lex_comma)) break;
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,(uint)local_59 * 2 + lex_greater,
                 "ERROR: \'>\' not found after explicit generic type alias list");
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,lex_oparen,"ERROR: \'(\' is expected at this point");
      IVar11 = ParseCallArguments(ctx);
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      node = (SynBase *)CONCAT44(extraout_var_04,iVar5);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
      local_48 = local_58.head;
      pSStack_40 = local_58.tail;
      SynBase::SynBase(node,0x1a,pLVar7,ctx->currentLexeme + -1);
      node->_vptr_SynBase = (_func_int **)&PTR__SynBase_002475a0;
      node[1]._vptr_SynBase = (_func_int **)pSVar10;
      *(SynBase **)&node[1].typeID = local_48;
      node[1].begin = (Lexeme *)pSStack_40;
      node[1].end = (Lexeme *)IVar11.head;
      node[1].pos.begin = (char *)IVar11.tail;
    }
    else {
      if (ctx->currentLexeme->type != lex_oparen) {
        anon_unknown.dwarf_15703::Stop(ctx,ctx->currentLexeme,"ERROR: not implemented");
      }
      ctx->currentLexeme = ctx->currentLexeme + 1;
      IVar11 = ParseCallArguments(ctx);
      anon_unknown.dwarf_15703::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      node = (SynBase *)CONCAT44(extraout_var_03,iVar5);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001147d5;
      SynBase::SynBase(node,0x1a,pLVar7,ctx->currentLexeme + -1);
      node->_vptr_SynBase = (_func_int **)&PTR__SynBase_002475a0;
      node[1]._vptr_SynBase = (_func_int **)pSVar10;
      *(undefined8 *)&node[1].typeID = 0;
      node[1].begin = (Lexeme *)0x0;
      node[1].end = (Lexeme *)IVar11.head;
      node[1].pos.begin = (char *)IVar11.tail;
    }
  }
LAB_00114759:
  if (ctx->currentLexeme->type == lex_dec) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar6 = (SynBase *)CONCAT44(extraout_var_06,iVar5);
    pLVar8 = ctx->currentLexeme;
    if (pLVar8 <= ctx->firstLexeme) {
LAB_001147d5:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    uVar9 = 0;
LAB_00114797:
    SynBase::SynBase(pSVar6,0x1c,pLVar7,pLVar8 + -1);
    pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_002475d8;
    pSVar6[1]._vptr_SynBase = (_func_int **)pSVar10;
    *(undefined1 *)&pSVar6[1].typeID = uVar9;
    pSVar10 = pSVar6;
  }
  return pSVar10;
}

Assistant:

SynBase* ParsePostExpressions(ParseContext &ctx, SynBase *node)
{
	while(ctx.At(lex_point) || ctx.At(lex_obracket) || ctx.At(lex_oparen) || ctx.At(lex_with))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_point))
		{
			if(ctx.At(lex_return) || CheckAt(ctx, lex_string, "ERROR: member name expected after '.'"))
			{
				InplaceStr member = ctx.Consume();
				SynIdentifier *memberIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), member);

				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(node->begin, ctx.Previous(), node, memberIdentifier);
			}
			else
			{
				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(ctx.Previous(), ctx.Previous(), node, NULL);
			}
		}
		else if(ctx.Consume(lex_obracket))
		{
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			node = new (ctx.get<SynArrayIndex>()) SynArrayIndex(pos, ctx.Previous(), node, arguments);
		}
		else if(ctx.Consume(lex_with))
		{
			IntrusiveList<SynBase> aliases;

			CheckConsume(ctx, lex_less, "ERROR: '<' not found before explicit generic type alias list");

			bool shrBorrow = false;

			do
			{
				SynBase *type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					if(aliases.empty())
						Report(ctx, ctx.Current(), "ERROR: type name is expected after 'with'");
					else
						Report(ctx, ctx.Current(), "ERROR: type name is expected after ','");

					break;
				}

				aliases.push_back(type);
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, shrBorrow ? lex_shr : lex_greater, "ERROR: '>' not found after explicit generic type alias list");

			CheckConsume(ctx, lex_oparen, "ERROR: '(' is expected at this point");

			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else if(ctx.Consume(lex_oparen))
		{
			IntrusiveList<SynBase> aliases;
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else
		{
			Stop(ctx, ctx.Current(), "ERROR: not implemented");
		}
	}

	Lexeme *pos = ctx.currentLexeme;

	if(ctx.Consume(lex_inc))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, true);
	else if(ctx.Consume(lex_dec))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, false);

	return node;
}